

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O2

int gen_holiday_fl(char *dest,int month,int day)

{
  undefined2 uVar1;
  long lVar2;
  
  lVar2 = 0xc;
  do {
    if (lVar2 == 0xac) {
      uVar1 = 0x30;
LAB_00103b0c:
      *(undefined2 *)dest = uVar1;
      return 0;
    }
    if ((*(int *)(lVar2 + 0x10c38c) == month) && (*(int *)((long)&holidays[0].name + lVar2) == day))
    {
      uVar1 = 0x31;
      goto LAB_00103b0c;
    }
    lVar2 = lVar2 + 0x10;
  } while( true );
}

Assistant:

int gen_holiday_fl(char * dest, int month, int day){
  int i;
  for(i = 0; i< NUM_HOLIDAYS; i++){
    if(holidays[i].month == month && holidays[i].day == day){
      strcpy(dest,"1");
      return 0;
    }
  }
  strcpy(dest,"0");
  return 0;
}